

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CalcListClipping
               (int items_count,float items_height,int *out_items_display_start,
               int *out_items_display_end)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ImRect unclipped_rect;
  ImRect local_48;
  float local_38;
  
  pIVar3 = GImGui;
  if (GImGui->LogEnabled == true) {
    *out_items_display_start = 0;
  }
  else {
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2->SkipItems == true) {
      *out_items_display_end = 0;
      *out_items_display_start = 0;
      return;
    }
    local_48.Min = (pIVar2->ClipRect).Min;
    local_48.Max = (pIVar2->ClipRect).Max;
    bVar4 = GImGui->NavMoveRequest;
    if ((bool)bVar4 == true) {
      local_38 = items_height;
      ImRect::Add(&local_48,&GImGui->NavScoringRectScreen);
      bVar4 = pIVar3->NavMoveRequest;
      items_height = local_38;
    }
    fVar1 = (pIVar2->DC).CursorPos.y;
    auVar9._0_4_ = local_48.Max.y - fVar1;
    auVar9._4_4_ = local_48.Min.y - fVar1;
    auVar9._8_4_ = local_48.Max.y - fVar1;
    auVar9._12_4_ = local_48.Max.y - fVar1;
    auVar10._4_4_ = items_height;
    auVar10._0_4_ = items_height;
    auVar10._8_4_ = items_height;
    auVar10._12_4_ = items_height;
    auVar10 = divps(auVar9,auVar10);
    iVar7 = (int)auVar10._0_4_;
    iVar8 = (int)auVar10._4_4_;
    if ((bVar4 & 1) != 0) {
      iVar5 = pIVar3->NavMoveClipDir;
      iVar7 = iVar7 - ((int)-(uint)(iVar5 == 3) >> 0x1f);
      iVar8 = iVar8 - (uint)(iVar5 == 2);
    }
    iVar5 = items_count;
    if (iVar8 < items_count) {
      iVar5 = iVar8;
    }
    iVar6 = 0;
    if (-1 < iVar8) {
      iVar6 = iVar5;
    }
    iVar7 = iVar7 + 1;
    if (iVar7 < items_count) {
      items_count = iVar7;
    }
    if (iVar7 < iVar6) {
      items_count = iVar6;
    }
    *out_items_display_start = iVar6;
  }
  *out_items_display_end = items_count;
  return;
}

Assistant:

void ImGui::CalcListClipping(int items_count, float items_height, int* out_items_display_start, int* out_items_display_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (g.LogEnabled)
    {
        // If logging is active, do not perform any clipping
        *out_items_display_start = 0;
        *out_items_display_end = items_count;
        return;
    }
    if (window->SkipItems)
    {
        *out_items_display_start = *out_items_display_end = 0;
        return;
    }

    // We create the union of the ClipRect and the NavScoringRect which at worst should be 1 page away from ClipRect
    ImRect unclipped_rect = window->ClipRect;
    if (g.NavMoveRequest)
        unclipped_rect.Add(g.NavScoringRectScreen);

    const ImVec2 pos = window->DC.CursorPos;
    int start = (int)((unclipped_rect.Min.y - pos.y) / items_height);
    int end = (int)((unclipped_rect.Max.y - pos.y) / items_height);

    // When performing a navigation request, ensure we have one item extra in the direction we are moving to
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Up)
        start--;
    if (g.NavMoveRequest && g.NavMoveClipDir == ImGuiDir_Down)
        end++;

    start = ImClamp(start, 0, items_count);
    end = ImClamp(end + 1, start, items_count);
    *out_items_display_start = start;
    *out_items_display_end = end;
}